

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

void gmath::svd(Matrixd *a,Matrixd *U,Vectord *W,Matrixd *V,bool thin)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  int i;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong *puVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined8 *puVar17;
  int iVar18;
  EVP_PKEY_CTX *pEVar19;
  EVP_PKEY_CTX *pEVar20;
  double *pdVar21;
  ulong uVar22;
  ulong uVar23;
  double *pdVar24;
  EVP_PKEY_CTX *pEVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  double *pdVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  undefined7 in_register_00000081;
  int i_4;
  long lVar35;
  EVP_PKEY_CTX *pEVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  EVP_PKEY_CTX *pEVar43;
  EVP_PKEY_CTX *pEVar44;
  int j_1;
  long lVar45;
  int i_2;
  EVP_PKEY_CTX *ctx;
  long lVar46;
  long lVar47;
  double *pdVar48;
  bool bVar49;
  double dVar50;
  double dVar51;
  ulong extraout_XMM0_Qb;
  undefined1 auVar52 [16];
  double dVar53;
  undefined1 in_XMM1 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  double dVar59;
  undefined1 auVar60 [16];
  double *local_160;
  double *local_158;
  long local_148;
  ulong local_140;
  double *local_100;
  double *local_e8;
  Matrixd A;
  long local_b8;
  long local_b0;
  double f;
  Vectord e;
  Vectord work;
  
  DMatrix<double>::DMatrix(&A,a);
  iVar29 = A.ncols;
  pEVar36 = (EVP_PKEY_CTX *)(ulong)(uint)A.nrows;
  lVar45 = (long)A.ncols;
  iVar14 = A.nrows;
  if (A.ncols < A.nrows) {
    iVar14 = A.ncols;
  }
  if ((int)CONCAT71(in_register_00000081,thin) == 0) {
    iVar14 = A.nrows;
  }
  DMatrix<double>::init(U,pEVar36);
  DMatrix<double>::operator=(U,0.0);
  uVar4 = A.nrows + 1U;
  if (iVar29 < (int)(A.nrows + 1U)) {
    uVar4 = iVar29;
  }
  ctx = (EVP_PKEY_CTX *)(ulong)uVar4;
  DVector<double>::init(W,ctx);
  DMatrix<double>::init(V,(EVP_PKEY_CTX *)(ulong)(uint)iVar29);
  DMatrix<double>::operator=(V,0.0);
  DVector<double>::DVector(&e,iVar29);
  DVector<double>::DVector(&work,A.nrows);
  pdVar24 = e.v;
  pdVar37 = A.v;
  uVar8 = A.nrows - 1;
  uVar5 = uVar8;
  if (iVar29 < (int)uVar8) {
    uVar5 = iVar29;
  }
  uVar13 = iVar29 - 2U;
  if (A.nrows < (int)(iVar29 - 2U)) {
    uVar13 = A.nrows;
  }
  local_148 = 0;
  pEVar19 = (EVP_PKEY_CTX *)0x0;
  if (0 < (int)uVar13) {
    pEVar19 = (EVP_PKEY_CTX *)(ulong)uVar13;
  }
  iVar18 = (int)pEVar19;
  pEVar20 = pEVar19;
  if (iVar18 < (int)uVar5) {
    pEVar20 = (EVP_PKEY_CTX *)(ulong)uVar5;
  }
  lVar28 = (long)A.nrows;
  pdVar39 = W->v;
  lVar32 = (long)A.ncols;
  iVar34 = A.ncols + 1;
  lVar46 = (long)(int)uVar5;
  local_140 = 1;
  local_100 = A.v;
  local_e8 = e.v;
  local_160 = A.v;
  pEVar25 = (EVP_PKEY_CTX *)0x0;
  local_158 = pdVar39;
  while( true ) {
    pdVar21 = e.v;
    iVar15 = (int)pEVar25;
    pEVar44 = pEVar25;
    if (iVar15 < A.nrows) {
      pEVar44 = pEVar36;
    }
    pEVar44 = (EVP_PKEY_CTX *)((ulong)pEVar44 & 0xffffffff);
    if (pEVar25 == pEVar20) break;
    if ((long)pEVar25 < lVar46) {
      pdVar21 = pdVar39 + (long)pEVar25;
      *pdVar21 = 0.0;
      dVar50 = 0.0;
      for (pEVar43 = pEVar44; pEVar25 != pEVar43; pEVar43 = pEVar43 + -1) {
        dVar50 = anon_unknown_22::hypot(dVar50,in_XMM1._0_8_);
        *pdVar21 = dVar50;
      }
      in_XMM1 = ZEXT816(0);
      if ((dVar50 != 0.0) || (NAN(dVar50))) {
        iVar9 = iVar34 * iVar15;
        pdVar30 = local_100;
        pEVar43 = pEVar44;
        if (pdVar37[iVar9] <= 0.0 && pdVar37[iVar9] != 0.0) {
          *pdVar21 = -dVar50;
        }
        for (; pEVar25 != pEVar43; pEVar43 = pEVar43 + -1) {
          *pdVar30 = *pdVar30 / *pdVar21;
          pdVar30 = pdVar30 + lVar32;
        }
        pdVar37[iVar9] = pdVar37[iVar9] + 1.0;
        dVar50 = *pdVar21;
      }
      *pdVar21 = -dVar50;
    }
    local_160 = A.v;
    lVar40 = (long)(int)local_140;
    lVar27 = lVar40 * 8;
    local_158 = W->v;
    lVar16 = (long)A.ncols;
    local_e8 = e.v;
    lVar33 = local_148 * lVar16 + lVar27;
    lVar35 = lVar27;
    for (lVar41 = lVar40; lVar41 < lVar45; lVar41 = lVar41 + 1) {
      if (((long)pEVar25 < lVar46) &&
         ((local_158[(long)pEVar25] != 0.0 || (NAN(local_158[(long)pEVar25]))))) {
        lVar42 = (long)A.ncols;
        dVar50 = 0.0;
        pdVar21 = A.v;
        for (pEVar43 = pEVar44; pEVar25 != pEVar43; pEVar43 = pEVar43 + -1) {
          in_XMM1._0_8_ =
               *(double *)((long)pdVar21 + (lVar42 + 1) * local_148) *
               *(double *)((long)pdVar21 + local_148 * lVar42 + lVar35);
          in_XMM1._8_8_ = 0;
          dVar50 = dVar50 + in_XMM1._0_8_;
          pdVar21 = pdVar21 + lVar42;
        }
        dVar53 = A.v[(A.ncols + 1) * iVar15];
        pdVar21 = A.v;
        for (pEVar43 = pEVar44; pEVar25 != pEVar43; pEVar43 = pEVar43 + -1) {
          in_XMM1._0_8_ =
               *(double *)((long)pdVar21 + (lVar16 + 1) * local_148) * (-dVar50 / dVar53) +
               *(double *)((long)pdVar21 + lVar33);
          in_XMM1._8_8_ = 0;
          *(double *)((long)pdVar21 + lVar33) = in_XMM1._0_8_;
          pdVar21 = pdVar21 + lVar16;
        }
      }
      e.v[lVar41] = A.v[(long)pEVar25 * lVar16 + lVar41];
      lVar35 = lVar35 + 8;
      lVar33 = lVar33 + 8;
    }
    if ((long)pEVar25 < lVar46) {
      iVar15 = U->ncols;
      pdVar21 = (double *)(((long)iVar15 + 1) * local_148 + (long)U->v);
      pdVar30 = (double *)(((long)A.ncols + 1) * local_148 + (long)A.v);
      for (; pEVar25 != pEVar44; pEVar44 = pEVar44 + -1) {
        *pdVar21 = *pdVar30;
        pdVar21 = pdVar21 + iVar15;
        pdVar30 = pdVar30 + A.ncols;
      }
    }
    pEVar44 = pEVar25 + 1;
    if ((long)pEVar25 < (long)(int)uVar13) {
      pdVar21 = pdVar24 + (long)pEVar25;
      *pdVar21 = 0.0;
      dVar50 = 0.0;
      uVar11 = 0;
      for (uVar26 = local_140 & 0xffffffff; (int)uVar26 < iVar29; uVar26 = (ulong)((int)uVar26 + 1))
      {
        dVar50 = anon_unknown_22::hypot(dVar50,in_XMM1._0_8_);
        *pdVar21 = dVar50;
        uVar11 = extraout_XMM0_Qb;
      }
      if ((dVar50 != 0.0) || (NAN(dVar50))) {
        uVar11 = local_140;
        if (pdVar24[(long)pEVar44] <= 0.0 && pdVar24[(long)pEVar44] != 0.0) {
          *pdVar21 = -dVar50;
        }
        for (; (int)uVar11 < iVar29; uVar11 = uVar11 + 1) {
          pdVar24[uVar11] = pdVar24[uVar11] / *pdVar21;
        }
        pdVar24[(long)pEVar44] = pdVar24[(long)pEVar44] + 1.0;
        dVar50 = *pdVar21;
        uVar11 = 0;
      }
      in_XMM1._0_8_ = -dVar50;
      in_XMM1._8_8_ = uVar11 ^ 0x8000000000000000;
      *pdVar21 = in_XMM1._0_8_;
      if (((long)pEVar44 < lVar28) && ((uVar11 = local_140, dVar50 != 0.0 || (NAN(dVar50))))) {
        for (; (int)uVar11 < A.nrows; uVar11 = uVar11 + 1) {
          work.v[uVar11] = 0.0;
        }
        lVar35 = lVar27;
        for (lVar41 = lVar40; lVar16 = lVar40, lVar41 < lVar45; lVar41 = lVar41 + 1) {
          pdVar21 = (double *)((long)A.v + lVar35 + lVar40 * 8 * (long)A.ncols);
          for (; lVar16 < lVar28; lVar16 = lVar16 + 1) {
            work.v[lVar16] = pdVar24[lVar41] * *pdVar21 + work.v[lVar16];
            pdVar21 = pdVar21 + A.ncols;
          }
          lVar35 = lVar35 + 8;
          local_160 = A.v;
        }
        for (; lVar16 < lVar45; lVar16 = lVar16 + 1) {
          dVar50 = pdVar24[lVar16];
          dVar53 = pdVar24[(long)pEVar44];
          pdVar21 = (double *)((long)A.v + lVar27 + lVar40 * 8 * (long)A.ncols);
          for (lVar35 = lVar40; lVar35 < lVar28; lVar35 = lVar35 + 1) {
            in_XMM1._0_8_ = work.v[lVar35] * (-dVar50 / dVar53) + *pdVar21;
            in_XMM1._8_8_ = 0;
            *pdVar21 = in_XMM1._0_8_;
            pdVar21 = pdVar21 + A.ncols;
          }
          lVar27 = lVar27 + 8;
          local_160 = A.v;
        }
      }
      iVar15 = V->ncols;
      pdVar21 = (double *)(lVar40 * (long)iVar15 * 8 + local_148 + (long)V->v);
      for (; lVar40 < lVar45; lVar40 = lVar40 + 1) {
        *pdVar21 = pdVar24[lVar40];
        pdVar21 = pdVar21 + iVar15;
      }
    }
    local_140 = local_140 + 1;
    local_148 = local_148 + 8;
    local_100 = local_100 + lVar32 + 1;
    pEVar25 = pEVar44;
  }
  if (A.nrows <= iVar29) {
    local_158[lVar46] = local_160[(int)(uVar5 * (A.ncols + 1))];
  }
  if (A.nrows < iVar29) {
    local_158[(long)(int)uVar4 + -1] = 0.0;
  }
  if (iVar18 + 1 < (int)uVar4) {
    local_e8[(long)pEVar19] = local_160[(int)(iVar18 * A.ncols + (uVar4 - 1))];
  }
  uVar11 = (ulong)(int)(uVar4 - 1);
  local_e8[uVar11] = 0.0;
  pdVar37 = U->v;
  iVar18 = U->ncols;
  pEVar19 = (EVP_PKEY_CTX *)0x0;
  if (0 < A.nrows) {
    pEVar19 = pEVar36;
  }
  lVar32 = lVar46 * 8;
  for (lVar27 = lVar46; lVar27 < iVar14; lVar27 = lVar27 + 1) {
    iVar34 = U->ncols;
    puVar17 = (undefined8 *)((long)U->v + lVar32);
    pEVar36 = pEVar19;
    while (bVar49 = pEVar36 != (EVP_PKEY_CTX *)0x0, pEVar36 = pEVar36 + -1, bVar49) {
      *puVar17 = 0;
      puVar17 = puVar17 + iVar34;
    }
    pdVar37[(iVar18 + 1) * (int)lVar27] = 1.0;
    lVar32 = lVar32 + 8;
  }
  pdVar24 = W->v;
  pdVar39 = U->v;
  iVar18 = U->ncols;
  iVar34 = iVar18 + 1;
  lVar41 = (long)(int)(uVar5 - 1);
  lVar27 = lVar46 * 8;
  lVar32 = lVar46 * 8;
  lVar35 = lVar41 * 8;
  pdVar37 = pdVar39 + lVar46;
  while( true ) {
    lVar32 = lVar32 + -8;
    pdVar37 = pdVar37 + -1;
    if (lVar46 < 1) break;
    lVar16 = lVar46 + -1;
    dVar50 = pdVar24[lVar16];
    pdVar30 = U->v;
    iVar15 = U->ncols;
    lVar33 = (long)iVar15;
    iVar9 = (int)lVar16;
    if ((dVar50 != 0.0) || (NAN(dVar50))) {
      lVar40 = lVar46;
      lVar42 = lVar27;
      while( true ) {
        lVar47 = (long)U->ncols;
        if (iVar14 <= lVar40) break;
        pdVar48 = (double *)((long)U->v + lVar35 * lVar47);
        dVar50 = 0.0;
        for (lVar38 = lVar41; lVar38 < lVar28; lVar38 = lVar38 + 1) {
          dVar50 = dVar50 + *(double *)((long)pdVar48 + lVar32) *
                            *(double *)((long)pdVar48 + lVar42);
          pdVar48 = pdVar48 + lVar47;
        }
        dVar53 = pdVar30[(iVar15 + 1) * iVar9];
        pdVar48 = (double *)(lVar35 * lVar33 + (long)pdVar30);
        for (lVar47 = lVar41; lVar47 < lVar28; lVar47 = lVar47 + 1) {
          *(double *)((long)pdVar48 + lVar42) =
               *(double *)((long)pdVar48 + lVar32) * (-dVar50 / dVar53) +
               *(double *)((long)pdVar48 + lVar42);
          pdVar48 = pdVar48 + lVar33;
        }
        lVar40 = lVar40 + 1;
        lVar42 = lVar42 + 8;
      }
      puVar12 = (ulong *)((long)U->v + lVar35 * lVar47 + lVar32);
      for (lVar33 = lVar41; lVar33 < lVar28; lVar33 = lVar33 + 1) {
        *puVar12 = *puVar12 ^ 0x8000000000000000;
        puVar12 = puVar12 + lVar47;
      }
      iVar9 = iVar34 * iVar9;
      dVar50 = pdVar39[iVar9] + 1.0;
      pdVar39[iVar9] = dVar50;
      pdVar30 = pdVar37;
      for (lVar33 = 0; lVar33 < lVar46 + -2; lVar33 = lVar33 + 1) {
        *pdVar30 = 0.0;
        pdVar30 = pdVar30 + iVar18;
      }
    }
    else {
      puVar17 = (undefined8 *)((long)pdVar30 + lVar32);
      pEVar36 = pEVar19;
      while (bVar49 = pEVar36 != (EVP_PKEY_CTX *)0x0, pEVar36 = pEVar36 + -1, bVar49) {
        *puVar17 = 0;
        puVar17 = puVar17 + lVar33;
      }
      pdVar39[iVar34 * iVar9] = 1.0;
    }
    in_XMM1._8_8_ = 0;
    in_XMM1._0_8_ = dVar50;
    lVar41 = lVar41 + -1;
    lVar27 = lVar27 + -8;
    lVar35 = lVar35 + -8;
    lVar46 = lVar16;
  }
  pdVar37 = V->v;
  iVar14 = V->ncols;
  uVar26 = 0;
  if (0 < iVar29) {
    uVar26 = (ulong)(uint)iVar29;
  }
  lVar28 = lVar45 * 8;
  lVar46 = lVar45 * 8;
  lVar32 = lVar45;
  while (lVar46 = lVar46 + -8, 0 < lVar32) {
    lVar27 = lVar32 + -1;
    pdVar24 = V->v;
    iVar29 = V->ncols;
    pdVar39 = pdVar24;
    if (lVar32 <= (int)uVar13) {
      dVar50 = local_e8[lVar27];
      in_XMM1._8_8_ = 0;
      in_XMM1._0_8_ = dVar50;
      if ((dVar50 != 0.0) || (NAN(dVar50))) {
        lVar16 = (long)iVar29;
        iVar18 = iVar29 * (int)lVar32;
        lVar33 = (lVar16 + 1) * lVar28;
        lVar35 = lVar32;
        lVar41 = lVar28;
        while( true ) {
          pdVar39 = V->v;
          iVar29 = V->ncols;
          if (lVar45 <= lVar35) break;
          pdVar39 = (double *)((long)pdVar39 + lVar28 * iVar29);
          dVar50 = 0.0;
          for (lVar40 = lVar32; lVar40 < lVar45; lVar40 = lVar40 + 1) {
            dVar50 = dVar50 + *(double *)((long)pdVar39 + lVar46) *
                              *(double *)((long)pdVar39 + lVar41);
            pdVar39 = pdVar39 + iVar29;
          }
          in_XMM1._0_8_ = -dVar50 / pdVar24[lVar27 + iVar18];
          in_XMM1._8_8_ = 0x8000000000000000;
          pdVar39 = pdVar24;
          for (lVar40 = lVar32; lVar40 < lVar45; lVar40 = lVar40 + 1) {
            *(double *)((long)pdVar39 + lVar33) =
                 *(double *)((long)pdVar39 + lVar28 * lVar16 + lVar46) * in_XMM1._0_8_ +
                 *(double *)((long)pdVar39 + lVar33);
            pdVar39 = pdVar39 + lVar16;
          }
          lVar35 = lVar35 + 1;
          lVar41 = lVar41 + 8;
          lVar33 = lVar33 + 8;
        }
      }
    }
    puVar17 = (undefined8 *)((long)pdVar39 + lVar46);
    uVar22 = uVar26;
    while (bVar49 = uVar22 != 0, uVar22 = uVar22 - 1, bVar49) {
      *puVar17 = 0;
      puVar17 = puVar17 + iVar29;
    }
    pdVar37[(iVar14 + 1) * (int)lVar27] = 1.0;
    lVar28 = lVar28 + -8;
    lVar32 = lVar27;
  }
  pdVar37 = W->v;
  iVar14 = uVar4 - 2;
  iVar18 = 2 - uVar4;
  local_b0 = uVar11 << 0x20;
  iVar29 = -uVar4;
  lVar45 = uVar11 * 8;
  lVar46 = (long)ctx - uVar11;
  local_b8 = -uVar11;
  auVar60 = _DAT_0015bbe0;
  local_158 = (double *)uVar11;
  do {
    iVar29 = iVar29 + 1;
    uVar22 = (ulong)iVar14;
    iVar34 = (int)ctx;
    lVar32 = (long)(iVar34 + -2);
    lVar28 = (long)(iVar34 + -1);
LAB_0014dff1:
    if (iVar34 < 1) {
      DVector<double>::~DVector(&work);
      DVector<double>::~DVector(&e);
      DMatrix<double>::~DMatrix(&A);
      return;
    }
    for (uVar23 = 0; uVar6 = auVar60._0_8_, ~uVar22 != uVar23; uVar23 = uVar23 - 1) {
      in_XMM1 = *(undefined1 (*) [16])(W->v + uVar22 + uVar23) & auVar60;
      if ((double)((ulong)e.v[uVar22 + uVar23] & uVar6) <=
          (in_XMM1._8_8_ + in_XMM1._0_8_) * 2.220446049250313e-16 + 1.6033346880071782e-291) {
        iVar15 = (int)uVar23 - iVar18;
        e.v[uVar22 + uVar23] = 0.0;
        goto LAB_0014e065;
      }
    }
    iVar15 = -1;
LAB_0014e065:
    if (iVar15 != iVar34 + -2) {
      lVar35 = (long)(iVar15 + 1);
      pdVar24 = local_158;
      lVar27 = local_b0;
      for (lVar41 = 0; iVar9 = (int)pdVar24, (long)iVar15 < (long)local_158 + lVar41;
          lVar41 = lVar41 + -1) {
        dVar53 = 0.0;
        dVar50 = 0.0;
        if (lVar46 != lVar41) {
          dVar50 = (double)(*(ulong *)((long)e.v + lVar41 * 8 + lVar45) & uVar6);
        }
        if (local_b8 + lVar35 != lVar41) {
          dVar53 = (double)(*(ulong *)((long)e.v + lVar41 * 8 + lVar45 + -8) & uVar6);
        }
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)((long)W->v + lVar41 * 8 + lVar45);
        in_XMM1 = auVar54 & auVar60;
        if (in_XMM1._0_8_ <= (dVar50 + dVar53) * 2.220446049250313e-16 + 1.6033346880071782e-291) {
          *(undefined8 *)((long)W->v + lVar41 * 8 + lVar45) = 0;
          break;
        }
        lVar27 = lVar27 + -0x100000000;
        pdVar24 = (double *)(ulong)(iVar9 - 1);
      }
      iVar31 = (int)lVar41;
      if (iVar29 + iVar15 == iVar31) {
        dVar51 = ABS(pdVar37[lVar28]);
        dVar50 = ABS(pdVar37[lVar32]);
        auVar55._8_8_ = pdVar21[lVar32];
        auVar55._0_8_ = pdVar37[lVar28];
        dVar53 = ABS(pdVar21[lVar32]);
        if (dVar50 <= dVar51) {
          dVar50 = dVar51;
        }
        dVar51 = ABS(pdVar37[lVar35]);
        if (dVar53 <= dVar50) {
          dVar53 = dVar50;
        }
        dVar50 = ABS(pdVar21[lVar35]);
        if (dVar51 <= dVar53) {
          dVar51 = dVar53;
        }
        if (dVar50 <= dVar51) {
          dVar50 = dVar51;
        }
        dVar58 = pdVar37[lVar32] / dVar50;
        auVar3._8_8_ = dVar50;
        auVar3._0_8_ = dVar50;
        in_XMM1 = divpd(auVar55,auVar3);
        dVar53 = in_XMM1._0_8_;
        dVar51 = in_XMM1._8_8_;
        dVar59 = (dVar51 * dVar51 + (dVar58 - dVar53) * (dVar58 + dVar53)) * 0.5;
        dVar58 = dVar53 * dVar51 * dVar53 * dVar51;
        dVar51 = 0.0;
        if ((((dVar58 != 0.0) || (NAN(dVar58))) || (dVar59 != 0.0)) || (NAN(dVar59))) {
          dVar51 = SQRT(dVar59 * dVar59 + dVar58);
          dVar51 = dVar58 / ((double)((ulong)-dVar51 & -(ulong)(dVar59 < 0.0) |
                                     ~-(ulong)(dVar59 < 0.0) & (ulong)dVar51) + dVar59);
        }
        dVar58 = pdVar37[lVar35] / dVar50;
        auVar52._0_8_ = (pdVar21[lVar35] / dVar50) * dVar58;
        auVar52._8_8_ = (dVar58 - dVar53) * (dVar58 + dVar53) + dVar51;
        pdVar24 = W->v;
        lVar27 = lVar35 * 8;
        lVar41 = lVar35;
        while (dVar50 = auVar52._8_8_, lVar41 < lVar28) {
          if ((dVar50 != 0.0) || (NAN(dVar50))) {
            dVar53 = auVar52._0_8_ / dVar50;
            dVar50 = SQRT(dVar53 * dVar53 + 1.0) * (double)((ulong)dVar50 & uVar6);
          }
          else {
            dVar50 = (double)((ulong)auVar52._0_8_ & uVar6);
          }
          if (lVar41 != lVar35) {
            e.v[lVar41 + -1] = dVar50;
          }
          auVar56._8_8_ = dVar50;
          auVar56._0_8_ = dVar50;
          auVar54 = divpd(auVar52,auVar56);
          dVar50 = pdVar24[lVar41];
          dVar53 = e.v[lVar41];
          dVar58 = auVar54._0_8_;
          dVar59 = auVar54._8_8_;
          e.v[lVar41] = dVar53 * dVar59 - dVar50 * dVar58;
          lVar16 = lVar41 + 1;
          dVar51 = pdVar24[lVar41 + 1];
          pdVar24[lVar41 + 1] = dVar59 * dVar51;
          iVar15 = V->ncols;
          pdVar39 = (double *)((long)V->v + lVar27);
          uVar23 = uVar26;
          while (bVar49 = uVar23 != 0, uVar23 = uVar23 - 1, bVar49) {
            dVar1 = *pdVar39;
            *pdVar39 = dVar1 * dVar59 + pdVar39[1] * dVar58;
            pdVar39[1] = dVar1 * -dVar58 + pdVar39[1] * dVar59;
            pdVar39 = pdVar39 + iVar15;
          }
          dVar50 = dVar50 * dVar59 + dVar58 * dVar53;
          auVar57._0_8_ = dVar51 * dVar58;
          if ((dVar50 != 0.0) || (NAN(dVar50))) {
            dVar53 = SQRT((auVar57._0_8_ / dVar50) * (auVar57._0_8_ / dVar50) + 1.0) *
                     (double)((ulong)dVar50 & uVar6);
          }
          else {
            dVar53 = (double)((ulong)auVar57._0_8_ & uVar6);
          }
          auVar57._8_8_ = dVar50;
          auVar2._8_4_ = SUB84(dVar53,0);
          auVar2._0_8_ = dVar53;
          auVar2._12_4_ = (int)((ulong)dVar53 >> 0x20);
          in_XMM1 = divpd(auVar57,auVar2);
          pdVar24[lVar41] = dVar53;
          dVar50 = e.v[lVar41];
          dVar53 = pdVar24[lVar16];
          dVar59 = in_XMM1._8_8_;
          dVar58 = in_XMM1._0_8_;
          pdVar24[lVar16] = dVar59 * dVar53 - dVar58 * dVar50;
          dVar51 = e.v[lVar16];
          e.v[lVar16] = dVar59 * dVar51;
          if (lVar41 < (int)uVar8) {
            iVar15 = U->ncols;
            pdVar39 = (double *)((long)U->v + lVar27);
            pEVar36 = pEVar19;
            while (bVar49 = pEVar36 != (EVP_PKEY_CTX *)0x0, pEVar36 = pEVar36 + -1, bVar49) {
              dVar1 = *pdVar39;
              *pdVar39 = dVar1 * dVar59 + pdVar39[1] * dVar58;
              pdVar39[1] = dVar1 * -dVar58 + pdVar39[1] * dVar59;
              pdVar39 = pdVar39 + iVar15;
            }
          }
          auVar52._0_8_ = dVar51 * dVar58;
          auVar52._8_8_ = dVar59 * dVar50 + dVar53 * dVar58;
          lVar27 = lVar27 + 8;
          lVar41 = lVar16;
        }
        pdVar21[lVar32] = dVar50;
      }
      else {
        iVar10 = iVar31 - iVar29;
        if (iVar31 == 0) {
          iVar10 = iVar15;
        }
        lVar35 = (long)(iVar10 + 1);
        if (iVar31 == 0) {
          dVar50 = pdVar21[lVar32];
          pdVar21[lVar32] = 0.0;
          pdVar24 = W->v;
          lVar27 = uVar22 * 8;
          local_e8 = (double *)dVar50;
          for (lVar41 = lVar32; auVar60 = _DAT_0015bbe0, iVar15 < lVar41; lVar41 = lVar41 + -1) {
            dVar50 = anon_unknown_22::hypot(dVar50,in_XMM1._0_8_);
            in_XMM1._0_8_ = pdVar24[lVar41] / dVar50;
            in_XMM1._8_8_ = 0;
            dVar53 = (double)local_e8 / dVar50;
            pdVar24[lVar41] = dVar50;
            dVar50 = -dVar53;
            if (lVar41 != lVar35) {
              local_e8 = (double *)(pdVar21[lVar41 + -1] * dVar50);
              pdVar21[lVar41 + -1] = pdVar21[lVar41 + -1] * in_XMM1._0_8_;
            }
            pdVar39 = V->v;
            iVar9 = V->ncols;
            uVar23 = uVar26;
            while (bVar49 = uVar23 != 0, uVar23 = uVar23 - 1, bVar49) {
              dVar51 = *(double *)((long)pdVar39 + lVar27);
              dVar58 = *(double *)((long)pdVar39 + lVar45);
              *(double *)((long)pdVar39 + lVar45) = dVar51 * dVar50 + dVar58 * in_XMM1._0_8_;
              *(double *)((long)pdVar39 + lVar27) = in_XMM1._0_8_ * dVar51 + dVar53 * dVar58;
              pdVar39 = pdVar39 + iVar9;
            }
            lVar27 = lVar27 + -8;
          }
        }
        else {
          dVar50 = *(double *)((long)pdVar21 + (lVar27 >> 0x1d));
          *(undefined8 *)((long)pdVar21 + (lVar27 >> 0x1d)) = 0;
          pdVar24 = W->v;
          lVar27 = lVar35 * 8;
          for (; auVar60 = _DAT_0015bbe0, lVar35 < (long)ctx; lVar35 = lVar35 + 1) {
            dVar53 = anon_unknown_22::hypot(dVar50,in_XMM1._0_8_);
            in_XMM1._0_8_ = pdVar24[lVar35] / dVar53;
            in_XMM1._8_8_ = 0;
            dVar51 = dVar50 / dVar53;
            pdVar24[lVar35] = dVar53;
            dVar53 = -dVar51;
            dVar50 = dVar53 * pdVar21[lVar35];
            pdVar21[lVar35] = pdVar21[lVar35] * in_XMM1._0_8_;
            pdVar39 = U->v;
            iVar15 = U->ncols;
            pEVar36 = pEVar19;
            while (bVar49 = pEVar36 != (EVP_PKEY_CTX *)0x0, pEVar36 = pEVar36 + -1, bVar49) {
              dVar58 = *(double *)((long)pdVar39 + lVar27);
              dVar59 = pdVar39[iVar9];
              pdVar39[iVar9] = dVar58 * dVar53 + dVar59 * in_XMM1._0_8_;
              *(double *)((long)pdVar39 + lVar27) = in_XMM1._0_8_ * dVar58 + dVar51 * dVar59;
              pdVar39 = pdVar39 + iVar15;
            }
            lVar27 = lVar27 + 8;
          }
        }
      }
      goto LAB_0014dff1;
    }
    dVar50 = pdVar37[lVar28];
    lVar32 = lVar45;
    if (dVar50 <= 0.0) {
      in_XMM1._0_8_ = -dVar50;
      in_XMM1._8_8_ = 0x8000000000000000;
      pdVar37[lVar28] = (double)(-(ulong)(dVar50 < in_XMM1._0_8_) & (ulong)in_XMM1._0_8_);
      iVar15 = V->ncols;
      puVar12 = (ulong *)((long)V->v + lVar45);
      uVar22 = uVar26;
      while (bVar49 = uVar22 != 0, uVar22 = uVar22 - 1, bVar49) {
        *puVar12 = *puVar12 ^ 0x8000000000000000;
        puVar12 = puVar12 + iVar15;
      }
    }
    while (lVar28 < (long)uVar11) {
      dVar50 = pdVar37[lVar28];
      dVar53 = pdVar37[lVar28 + 1];
      in_XMM1._8_8_ = 0;
      in_XMM1._0_8_ = dVar53;
      if (dVar53 <= dVar50) break;
      pdVar37[lVar28] = dVar53;
      pdVar37[lVar28 + 1] = dVar50;
      iVar15 = V->ncols;
      puVar17 = (undefined8 *)((long)V->v + lVar32);
      uVar22 = uVar26;
      while (bVar49 = uVar22 != 0, uVar22 = uVar22 - 1, bVar49) {
        uVar7 = *puVar17;
        *puVar17 = puVar17[1];
        puVar17[1] = uVar7;
        puVar17 = puVar17 + iVar15;
      }
      if (lVar28 < (int)uVar8) {
        iVar15 = U->ncols;
        puVar17 = (undefined8 *)((long)U->v + lVar32);
        pEVar36 = pEVar19;
        while (bVar49 = pEVar36 != (EVP_PKEY_CTX *)0x0, pEVar36 = pEVar36 + -1, bVar49) {
          uVar7 = *puVar17;
          *puVar17 = puVar17[1];
          puVar17[1] = uVar7;
          puVar17 = puVar17 + iVar15;
        }
      }
      lVar32 = lVar32 + 8;
      lVar28 = lVar28 + 1;
    }
    ctx = (EVP_PKEY_CTX *)(ulong)(iVar34 - 1);
    iVar14 = iVar14 + -1;
    iVar18 = iVar18 + 1;
    local_b0 = local_b0 + -0x100000000;
    lVar45 = lVar45 + -8;
    local_b8 = local_b8 + 1;
    local_158 = (double *)((long)local_158 - 1);
  } while( true );
}

Assistant:

void svd(const Matrixd &a, Matrixd &U, Vectord &W, Matrixd &V, bool thin)
{
  const bool wantu=true;
  const bool wantv=true;

  Matrixd A(a);

  const int m=A.rows();
  const int n=A.cols();
  const int ncu=thin?std::min(m, n):m;

  U.init(m, ncu); U=0;
  W.init(std::min(m+1, n));
  V.init(n, n); V=0;

  Vectord e(n);
  Vectord work(m);

  // Reduce A to bidiagonal form, storing the diagonal elements
  // in W and the super-diagonal elements in e.

  int nct=std::min(m-1, n);
  int nrt=std::max(0, std::min(n-2, m));
  int lu=std::max(nct, nrt);

  for (int k=0; k<lu; k++)
  {
    if (k < nct)
    {
      // Compute the transformation for the k-th column and
      // place the k-th diagonal in W[k].
      // Compute 2-norm of k-th column without under/overflow.

      W[k]=0;

      for (int i=k; i<m; i++)
      {
        W[k]=hypot(W[k], A(i, k));
      }

      if (W[k] != 0.0)
      {
        if (A(k, k) < 0.0)
        {
          W[k]=-W[k];
        }

        for (int i=k; i<m; i++)
        {
          A(i, k)/=W[k];
        }

        A(k, k)+=1.0;
      }

      W[k]=-W[k];
    }

    for (int j=k+1; j<n; j++)
    {
      if ((k < nct) & (W[k] != 0.0))
      {
        // Apply the transformation.

        double t=0;

        for (int i=k; i<m; i++)
        {
          t+=A(i, k)*A(i, j);
        }

        t=-t/A(k, k);

        for (int i=k; i<m; i++)
        {
          A(i, j)+=t*A(i, k);
        }
      }

      // Place the k-th row of A into e for the
      // subsequent calculation of the row transformation.

      e[j]=A(k, j);
    }

    if (wantu & (k < nct))
    {
      // Place the transformation in U for subsequent back
      // multiplication.

      for (int i=k; i<m; i++)
      {
        U(i, k)=A(i, k);
      }
    }

    if (k < nrt)
    {
      // Compute the k-th row transformation and place the
      // k-th super-diagonal in e[k].
      // Compute 2-norm without under/overflow.

      e[k]=0;

      for (int i=k+1; i<n; i++)
      {
        e[k]=hypot(e[k], e[i]);
      }

      if (e[k] != 0.0)
      {
        if (e[k+1] < 0.0)
        {
          e[k]=-e[k];
        }

        for (int i=k+1; i<n; i++)
        {
          e[i]/=e[k];
        }

        e[k+1]+=1.0;
      }

      e[k]=-e[k];

      if ((k+1 < m) & (e[k] != 0.0))
      {
        // Apply the transformation.

        for (int i=k+1; i<m; i++)
        {
          work[i]=0.0;
        }

        for (int j=k+1; j<n; j++)
        {
          for (int i=k+1; i<m; i++)
          {
            work[i]+=e[j]*A(i, j);
          }
        }

        for (int j=k+1; j<n; j++)
        {
          double t=-e[j]/e[k+1];

          for (int i=k+1; i<m; i++)
          {
            A(i, j)+=t*work[i];
          }
        }
      }

      if (wantv)
      {
        // Place the transformation in V for subsequent
        // back multiplication.

        for (int i=k+1; i<n; i++)
        {
          V(i, k)=e[i];
        }
      }
    }
  }

  // Set up the final bidiagonal matrix or order p.

  int p=std::min(n, m+1);

  if (nct < n)
  {
    W[nct]=A(nct, nct);
  }

  if (m < p)
  {
    W[p-1]=0.0;
  }

  if (nrt+1 < p)
  {
    e[nrt]=A(nrt, p-1);
  }

  e[p-1]=0.0;

  // If required, generate U.

  if (wantu)
  {
    for (int j=nct; j<ncu; j++)
    {
      for (int i=0; i<m; i++)
      {
        U(i, j)=0.0;
      }

      U(j, j)=1.0;
    }

    for (int k=nct-1; k>=0; k--)
    {
      if (W[k] != 0.0)
      {
        for (int j=k+1; j<ncu; j++)
        {
          double t=0;

          for (int i=k; i<m; i++)
          {
            t+=U(i, k)*U(i, j);
          }

          t=-t/U(k, k);

          for (int i=k; i<m; i++)
          {
            U(i, j)+=t*U(i, k);
          }
        }

        for (int i=k; i<m; i++)
        {
          U(i, k)=-U(i, k);
        }

        U(k, k)+=1.0;

        for (int i=0; i<k-1; i++)
        {
          U(i, k)=0.0;
        }
      }
      else
      {
        for (int i=0; i<m; i++)
        {
          U(i, k)=0.0;
        }

        U(k, k)=1.0;
      }
    }
  }

  // If required, generate V.

  if (wantv)
  {
    for (int k=n-1; k>=0; k--)
    {
      if ((k < nrt) & (e[k] != 0.0))
      {
        for (int j=k+1; j<n; j++)
        {
          double t=0;

          for (int i=k+1; i<n; i++)
          {
            t+=V(i, k)*V(i, j);
          }

          t=-t/V(k+1, k);

          for (int i=k+1; i<n; i++)
          {
            V(i, j)+=t*V(i, k);
          }
        }
      }

      for (int i=0; i<n; i++)
      {
        V(i, k)=0.0;
      }

      V(k, k)=1.0;
    }
  }

  // Main iteration loop for the singular values.

  int pp=p-1;
  int iter=0;
  double eps=pow(2.0,-52.0);
  double tiny=pow(2.0,-966.0);

  while (p > 0)
  {
    int k, kase;

    // Here is where a test for too many iterations would go.

    // This section of the program inspects for
    // negligible elements in the s and e arrays. On
    // completion the variables kase and k are set as follows.

    // kase = 1     if s(p) and e[k-1] are negligible and k<p
    // kase = 2     if s(k) is negligible and k<p
    // kase = 3     if e[k-1] is negligible, k<p, and
    //              s(k), ..., s(p) are not negligible (qr step).
    // kase = 4     if e(p-1) is negligible (convergence).

    for (k=p-2; k>=-1; k--)
    {
      if (k == -1)
      {
        break;
      }

      if (std::abs(e[k]) <= tiny+eps*(std::abs(W[k])+std::abs(W[k+1])))
      {
        e[k]=0.0;
        break;
      }
    }

    if (k == p-2)
    {
      kase=4;
    }
    else
    {
      int ks;

      for (ks=p-1; ks>=k; ks--)
      {
        if (ks == k)
        {
          break;
        }

        double t=(ks != p ? std::abs(e[ks]) : 0.) +
                 (ks != k+1 ? std::abs(e[ks-1]) : 0.);

        if (std::abs(W[ks]) <= tiny+eps*t)
        {
          W[ks]=0.0;
          break;
        }
      }

      if (ks == k)
      {
        kase=3;
      }
      else if (ks == p-1)
      {
        kase=1;
      }
      else
      {
        kase=2;
        k=ks;
      }
    }

    k++;

    // Perform the task indicated by kase.

    switch (kase)
    {

        // Deflate negligible s(p).

      case 1:
        {
          double f=e[p-2];
          e[p-2]=0.0;

          for (int j=p-2; j>=k; j--)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;

            if (j != k)
            {
              f=-sn*e[j-1];
              e[j-1]=cs*e[j-1];
            }

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, p-1);
                V(i, p-1)=-sn*V(i, j)+cs*V(i, p-1);
                V(i, j)=t;
              }
            }
          }
        }
        break;

        // Split at negligible s(k).

      case 2:
        {
          double f=e[k-1];
          e[k-1]=0.0;

          for (int j=k; j<p; j++)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;
            f=-sn*e[j];
            e[j]=cs*e[j];

            if (wantu)
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, k-1);
                U(i, k-1)=-sn*U(i, j)+cs*U(i, k-1);
                U(i, j)=t;
              }
            }
          }
        }
        break;

        // Perform one qr step.

      case 3:
        {

          // Calculate the shift.

          double scale=std::max(std::max(std::max(std::max(std::abs(W[p-1]), std::abs(W[p-2])),
                                                  std::abs(e[p-2])), std::abs(W[k])), std::abs(e[k]));
          double sp=W[p-1]/scale;
          double spm1=W[p-2]/scale;
          double epm1=e[p-2]/scale;
          double sk=W[k]/scale;
          double ek=e[k]/scale;
          double b=((spm1+sp)*(spm1-sp)+epm1*epm1)/2.0;
          double c=(sp*epm1)*(sp*epm1);
          double shift=0.0;

          if ((b != 0.0) | (c != 0.0))
          {
            shift=sqrt(b*b + c);

            if (b < 0.0)
            {
              shift=-shift;
            }

            shift=c/(b + shift);
          }

          double f=(sk + sp)*(sk - sp) + shift;
          double g=sk*ek;

          // Chase zeros.

          for (int j=k; j<p-1; j++)
          {
            double t=hypot(f, g);
            double cs=f/t;
            double sn=g/t;

            if (j != k)
            {
              e[j-1]=t;
            }

            f=cs*W[j]+sn*e[j];
            e[j]=cs*e[j]-sn*W[j];
            g=sn*W[j+1];
            W[j+1]=cs*W[j+1];

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, j+1);
                V(i, j+1)=-sn*V(i, j)+cs*V(i, j+1);
                V(i, j)=t;
              }
            }

            t=hypot(f,g);
            cs=f/t;
            sn=g/t;
            W[j]=t;
            f=cs*e[j]+sn*W[j+1];
            W[j+1]=-sn*e[j]+cs*W[j+1];
            g=sn*e[j+1];
            e[j+1]=cs*e[j+1];

            if (wantu && (j < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, j+1);
                U(i, j+1)=-sn*U(i, j)+cs*U(i, j+1);
                U(i, j)=t;
              }
            }
          }

          e[p-2]=f;
          iter++;
        }
        break;

        // Convergence.

      case 4:
        {

          // Make the singular values positive.

          if (W[k] <= 0.0)
          {
            W[k]=(W[k] < 0.0 ? -W[k] : 0.0);

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                V(i, k)=-V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp)
          {
            if (W[k] >= W[k+1])
            {
              break;
            }

            double t=W[k];
            W[k]=W[k+1];
            W[k+1]=t;

            if (wantv && (k < n-1))
            {
              for (int i=0; i<n; i++)
              {
                t=V(i, k+1);
                V(i, k+1)=V(i, k);
                V(i, k)=t;
              }
            }

            if (wantu && (k < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=U(i, k+1);
                U(i, k+1)=U(i, k);
                U(i, k)=t;
              }
            }

            k++;
          }

          iter=0;
          p--;
        }
        break;
    }
  }
}